

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O1

QString * qt_strippedText(QString *__return_storage_ptr__,QString *s)

{
  ulong uVar1;
  QLatin1String QVar2;
  
  QVar2.m_data = (char *)0x3;
  QVar2.m_size = (qsizetype)s;
  QString::remove(QVar2,0x6aed77);
  if ((s->d).size != 0) {
    uVar1 = 0;
    do {
      if ((s->d).ptr[uVar1] == L'&') {
        QString::remove((longlong)s,uVar1);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)(s->d).size);
  }
  QString::trimmed_helper(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static QString qt_strippedText(QString s)
{
    s.remove("..."_L1);
    for (int i = 0; i < s.size(); ++i) {
        if (s.at(i) == u'&')
            s.remove(i, 1);
    }
    return s.trimmed();
}